

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonetree.h
# Opt level: O3

void __thiscall
asmjit::v1_14::ZoneTree<asmjit::v1_14::AddressTableEntry>::
insert<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>
          (ZoneTree<asmjit::v1_14::AddressTableEntry> *this,AddressTableEntry *node,
          Compare<(asmjit::v1_14::Support::SortOrder)0> *cmp)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  AddressTableEntry *pAVar8;
  ulong extraout_RAX;
  sbyte sVar9;
  AddressTableEntry *pAVar10;
  AddressTableEntry *pAVar11;
  uint uVar12;
  AddressTableEntry *pAVar13;
  byte *extraout_RDX;
  char *extraout_RDX_00;
  OffsetFormat *format;
  ulong uVar14;
  int iVar15;
  AddressTableEntry *pAVar16;
  ulong uVar17;
  byte *pbVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  ulong *puVar22;
  ZoneTreeNode *save;
  byte *pbVar23;
  bool bVar24;
  ZoneTreeNode head;
  ulong uStack_70;
  undefined8 local_40;
  AddressTableEntry *local_38;
  
  if (*(ulong *)node < 2) {
    if (*(long *)(node + 8) != 0) goto LAB_00119594;
    if (*(ulong *)node == 0) {
      pAVar11 = *(AddressTableEntry **)this;
      if (pAVar11 == (AddressTableEntry *)0x0) {
        *(AddressTableEntry **)this = node;
      }
      else {
        pAVar8 = (AddressTableEntry *)&local_40;
        local_40 = 0;
        local_38 = pAVar11;
        *(undefined8 *)node = 1;
        pAVar13 = (AddressTableEntry *)0x0;
        pAVar16 = (AddressTableEntry *)0x0;
        uVar14 = 0;
        uVar20 = 0;
        while( true ) {
          uVar17 = uVar14;
          if (pAVar11 == (AddressTableEntry *)0x0) {
            *(ulong *)(pAVar16 + uVar17 * 8) =
                 (ulong)((uint)*(undefined8 *)(pAVar16 + uVar17 * 8) & 1) | (ulong)node;
            pAVar10 = node;
          }
          else {
            pbVar18 = (byte *)(*(ulong *)pAVar11 & 0xfffffffffffffffe);
            pAVar10 = pAVar11;
            if ((((pbVar18 != (byte *)0x0) && ((*pbVar18 & 1) != 0)) &&
                (*(byte **)(pAVar11 + 8) != (byte *)0x0)) && ((**(byte **)(pAVar11 + 8) & 1) != 0))
            {
              *(ulong *)pAVar11 = *(ulong *)pAVar11 | 1;
              *pbVar18 = *pbVar18 & 0xfe;
              **(ulong **)(pAVar11 + 8) = **(ulong **)(pAVar11 + 8) & 0xfffffffffffffffe;
            }
          }
          if (((pAVar16 != (AddressTableEntry *)0x0) && ((*(ulong *)pAVar10 & 1) != 0)) &&
             (((byte)*pAVar16 & 1) != 0)) {
            pAVar11 = *(AddressTableEntry **)(pAVar8 + 8);
            bVar24 = uVar20 == 0;
            uVar14 = (ulong)!bVar24;
            pbVar18 = (byte *)(*(ulong *)(pAVar13 + uVar14 * 8) & 0xfffffffffffffffe);
            pbVar23 = (byte *)(*(ulong *)(pbVar18 + (ulong)bVar24 * 8) & 0xfffffffffffffffe);
            if (pAVar10 ==
                (AddressTableEntry *)(*(ulong *)(pAVar16 + uVar20 * 8) & 0xfffffffffffffffe)) {
              puVar22 = (ulong *)(pbVar18 + (ulong)bVar24 * 8);
              uVar20 = (ulong)pbVar23 | (ulong)((uint)*(ulong *)(pAVar13 + uVar14 * 8) & 1);
            }
            else {
              uVar21 = (uint)!bVar24 * 8;
              lVar19 = (ulong)bVar24 * 8;
              *(ulong *)(pbVar18 + lVar19) =
                   (ulong)((uint)*(ulong *)(pbVar18 + (ulong)bVar24 * 8) & 1) |
                   *(ulong *)(pbVar23 + uVar21) & 0xfffffffffffffffe;
              *(ulong *)(pbVar23 + uVar21) =
                   (ulong)((uint)*(undefined8 *)(pbVar23 + uVar21) & 1) | (ulong)pbVar18;
              *pbVar18 = *pbVar18 | 1;
              *pbVar23 = *pbVar23 & 0xfe;
              uVar20 = (ulong)((uint)*(undefined8 *)(pAVar13 + uVar21) & 1);
              *(ulong *)(pAVar13 + uVar21) = uVar20 | (ulong)pbVar23;
              puVar22 = (ulong *)(pbVar23 + lVar19);
              uVar20 = *(ulong *)(pbVar23 + lVar19) & 0xfffffffffffffffe | uVar20;
              pbVar18 = pbVar23;
            }
            *(ulong *)(pAVar13 + uVar14 * 8) = uVar20;
            *puVar22 = (ulong)((uint)*puVar22 & 1) | (ulong)pAVar13;
            *pAVar13 = (AddressTableEntry)((byte)*pAVar13 | 1);
            *pbVar18 = *pbVar18 & 0xfe;
            *(ulong *)(pAVar8 + (ulong)(pAVar13 == pAVar11) * 8) =
                 (ulong)((uint)*(undefined8 *)(pAVar8 + (ulong)(pAVar13 == pAVar11) * 8) & 1) |
                 (ulong)pbVar18;
          }
          if (pAVar10 == node) break;
          if (pAVar13 != (AddressTableEntry *)0x0) {
            pAVar8 = pAVar13;
          }
          pAVar11 = (AddressTableEntry *)
                    (*(ulong *)(pAVar10 +
                               (ulong)(*(ulong *)(pAVar10 + 0x10) < *(ulong *)(node + 0x10)) * 8) &
                    0xfffffffffffffffe);
          pAVar13 = pAVar16;
          pAVar16 = pAVar10;
          uVar14 = (ulong)(*(ulong *)(pAVar10 + 0x10) < *(ulong *)(node + 0x10));
          uVar20 = uVar17;
        }
        *(AddressTableEntry **)this = local_38;
        *local_38 = (AddressTableEntry)((byte)*local_38 & 0xfe);
      }
      return;
    }
  }
  else {
    insert<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>();
LAB_00119594:
    insert<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>();
  }
  insert<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>();
  bVar1 = extraout_RDX[5];
  if (bVar1 == 0) {
    return;
  }
  bVar2 = extraout_RDX[3];
  uVar21 = 0;
  if ((uint)bVar2 * 8 < (uint)bVar1) {
    return;
  }
  bVar3 = extraout_RDX[6];
  bVar4 = extraout_RDX[7];
  bVar5 = *extraout_RDX;
  if (bVar5 - 8 < 3) {
LAB_001195ef:
    uVar21 = (uint)(-1 < (long)node);
    if ((long)node < 1) {
      node = (AddressTableEntry *)-(long)node;
    }
LAB_00119603:
    if (bVar4 != 0) {
      if (0x20 < bVar4) {
        CodeWriterUtils::encodeOffset32();
LAB_001198d2:
        CodeWriterUtils::encodeOffset32();
        bVar1 = extraout_RDX_00[5];
        if ((bVar1 != 0) && ((uint)bVar1 <= (uint)(byte)extraout_RDX_00[3] << 3)) {
          bVar2 = extraout_RDX_00[7];
          if (*extraout_RDX_00 == '\x01') {
            if (bVar2 != 0) {
              if (0x20 < bVar2) {
                CodeWriterUtils::encodeOffset64();
LAB_001199b7:
                CodeWriterUtils::encodeOffset64();
                if (format->_valueSize - 1 < 8) {
                  bVar1 = format->_valueOffset;
                  uStack_70 = extraout_RAX;
                  switch((uint)format->_valueSize) {
                  case 1:
                    bVar24 = CodeWriterUtils::encodeOffset32
                                       ((uint32_t *)&uStack_70,(int64_t)node,format);
                    if (bVar24) {
                      this[bVar1] = (ZoneTree<asmjit::v1_14::AddressTableEntry>)
                                    ((byte)this[bVar1] | (byte)uStack_70);
                    }
                    break;
                  case 2:
                    bVar24 = CodeWriterUtils::encodeOffset32
                                       ((uint32_t *)&uStack_70,(int64_t)node,format);
                    if (bVar24) {
                      *(ushort *)(this + bVar1) = *(ushort *)(this + bVar1) | (ushort)uStack_70;
                    }
                    break;
                  case 4:
                    bVar24 = CodeWriterUtils::encodeOffset32
                                       ((uint32_t *)&uStack_70,(int64_t)node,format);
                    if (bVar24) {
                      *(uint *)(this + bVar1) = *(uint *)(this + bVar1) | (uint)uStack_70;
                    }
                    break;
                  case 8:
                    bVar24 = CodeWriterUtils::encodeOffset64(&uStack_70,(int64_t)node,format);
                    if (bVar24) {
                      *(ulong *)(this + bVar1) = *(ulong *)(this + bVar1) | uStack_70;
                    }
                  }
                }
                return;
              }
              if ((((uint)(-1L << (bVar2 & 0x3f)) & 0xfffffffe ^ 0xffffffff) & (uint)node) != 0) {
                return;
              }
              node = (AddressTableEntry *)((ulong)node >> (bVar2 & 0x3f));
            }
            pAVar11 = (AddressTableEntry *)(0xffffffffffffffff >> (-bVar1 & 0x3f));
            if (pAVar11 < node) {
              return;
            }
            node = (AddressTableEntry *)((ulong)node & (ulong)pAVar11);
          }
          else {
            if (bVar2 != 0) {
              if (0x20 < bVar2) goto LAB_001199b7;
              if ((((uint)(-1L << (bVar2 & 0x3f)) & 0xfffffffe ^ 0xffffffff) & (uint)node) != 0) {
                return;
              }
              node = (AddressTableEntry *)((long)node >> (bVar2 & 0x3f));
            }
            if (*extraout_RDX_00 != '\0') {
              return;
            }
            if ((AddressTableEntry *)(((long)node << (-bVar1 & 0x3f)) >> (-bVar1 & 0x3f)) != node) {
              return;
            }
            pAVar11 = (AddressTableEntry *)(0xffffffffffffffff >> (-bVar1 & 0x3f));
          }
          *(ulong *)this = ((ulong)pAVar11 & (ulong)node) << (extraout_RDX_00[6] & 0x3fU);
        }
        return;
      }
      if (((uint)node & ((uint)(-1L << (bVar4 & 0x3f)) & 0xfffffffe ^ 0xffffffff)) != 0) {
        return;
      }
      node = (AddressTableEntry *)((ulong)node >> (bVar4 & 0x3f));
    }
    uVar12 = ~(uint)(-1L << (bVar1 & 0x3f)) & (uint)node;
    bVar24 = node != (AddressTableEntry *)(ulong)uVar12;
    node = (AddressTableEntry *)(ulong)uVar12;
    if (bVar24) {
      return;
    }
  }
  else {
    if (bVar5 == 1) goto LAB_00119603;
    if (bVar5 == 4) goto LAB_001195ef;
    if (bVar4 != 0) {
      if (bVar4 < 0x21) {
        if ((((uint)(-1L << (bVar4 & 0x3f)) & 0xfffffffe ^ 0xffffffff) & (uint)node) != 0) {
          return;
        }
        node = (AddressTableEntry *)((long)node >> (bVar4 & 0x3f));
        goto LAB_001196b2;
      }
      goto LAB_001198d2;
    }
LAB_001196b2:
    iVar15 = (int)node;
    uVar21 = 0;
    if ((AddressTableEntry *)(long)iVar15 != node) {
      return;
    }
    if ((iVar15 << (-bVar1 & 0x1f)) >> (-bVar1 & 0x1f) != iVar15) {
      return;
    }
  }
  uVar12 = (uint)node;
  switch(bVar5) {
  case 0:
  case 1:
    uVar21 = (uVar12 & ~(uint)(-1L << (bVar1 & 0x3f))) << (bVar3 & 0x1f);
    break;
  case 2:
  case 3:
    if (bVar3 != 5) {
      return;
    }
    if (bVar1 != 0x15) {
      return;
    }
    if (bVar2 != 4) {
      return;
    }
    uVar21 = (uVar12 & 3) * 0x20000000 + (uVar12 & 0x1ffffc) * 8;
    break;
  case 4:
    if (bVar3 != 0) {
      return;
    }
    if (bVar1 != 0xc) {
      return;
    }
    if (bVar2 != 4) {
      return;
    }
    uVar7 = (uVar12 & 0x800) << 0xf;
    uVar21 = (uVar21 ^ 1) << 0x17 | (uVar21 ^ 1) << 0x15 | uVar12 & 0xff | (uVar12 & 0x700) << 4;
    goto LAB_001198be;
  case 5:
    node = (AddressTableEntry *)(ulong)(uVar12 * 2);
  case 6:
    if (bVar2 != 4) {
      return;
    }
    uVar21 = (uint)node;
    uVar21 = ((uVar21 >> 0x15 ^ ~uVar21 >> 0x17) & 1) << 0xb |
             (((uint)((ulong)node >> 0x16) & 0x3ff ^ ~uVar21 >> 0x17) & 1) << 0xe |
             ((uVar21 & 0x1ff800) << 5 | uVar21 & 0x7ff) + (uVar21 & 0x800000) * 8;
    break;
  case 7:
    if (bVar3 != 0) {
      return;
    }
    if (bVar1 != 0x14) {
      return;
    }
    if (bVar2 != 4) {
      return;
    }
    uVar21 = ((uVar12 >> 0x15 ^ ~uVar12 >> 0x13) & 1) << 0xb |
             (((uint)((ulong)node >> 0x16) & 0x3ff ^ ~uVar12 >> 0x13) & 1) << 0xe |
             (uVar12 & 0x80000) << 7 | (uVar12 & 0x1f800) << 5 | uVar12 & 0x7ff;
    break;
  case 8:
    if (0xff < uVar12) {
      uVar7 = uVar12 << 0x10 | uVar12 >> 0x10;
      if (((ulong)node & 0xff0000ff) == 0) {
        uVar7 = uVar12;
      }
      uVar6 = 0;
      if (uVar7 != 0) {
        for (; (uVar7 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
      sVar9 = (sbyte)(uVar6 & 0x1e);
      uVar12 = uVar7 >> sVar9 | uVar7 << 0x20 - sVar9;
      if (0xff < uVar12) {
        return;
      }
      uVar12 = ((uint)(((ulong)node & 0xff0000ff) != 0) * 0x10 - (uVar6 & 0x1e) & 0x1e) << 7 |
               uVar12;
    }
    uVar7 = 0x400000 << (sbyte)uVar21;
    uVar21 = uVar12 << (bVar3 & 0x1f);
    goto LAB_001197d8;
  case 9:
    uVar7 = uVar12 << (bVar3 & 0x1f);
    goto LAB_001198ba;
  case 10:
    if (bVar3 != 0) {
      return;
    }
    if (bVar1 != 8) {
      return;
    }
    if (bVar2 != 4) {
      return;
    }
    uVar7 = (uVar12 & 0xf0) << 4 | uVar12 & 0xf;
LAB_001198ba:
    uVar21 = uVar21 << 0x17;
LAB_001198be:
    uVar21 = uVar21 | uVar7;
    break;
  case 0xb:
    if (bVar3 != 0) {
      return;
    }
    if (bVar1 != 0x19) {
      return;
    }
    if (bVar2 != 4) {
      return;
    }
    uVar7 = (uVar12 & 1) << 0x18;
    uVar21 = uVar12 >> 1 & 0xffffff;
LAB_001197d8:
    uVar21 = uVar21 | uVar7;
    break;
  default:
    goto LAB_00119836;
  }
  *(uint *)this = uVar21;
LAB_00119836:
  return;
}

Assistant:

void insert(NodeT* ASMJIT_NONNULL(node), const CompareT& cmp = CompareT()) noexcept {
    // Node to insert must not contain garbage.
    ASMJIT_ASSERT(!node->hasLeft());
    ASMJIT_ASSERT(!node->hasRight());
    ASMJIT_ASSERT(!node->isRed());

    if (!_root) {
      _root = node;
      return;
    }

    ZoneTreeNode head;           // False root node,
    head._setRight(_root);       // having root on the right.

    ZoneTreeNode* g = nullptr;   // Grandparent.
    ZoneTreeNode* p = nullptr;   // Parent.
    ZoneTreeNode* t = &head;     // Iterator.
    ZoneTreeNode* q = _root;     // Query.

    size_t dir = 0;              // Direction for accessing child nodes.
    size_t last = 0;             // Not needed to initialize, but makes some tools happy.

    node->_makeRed();            // New nodes are always red and violations fixed appropriately.

    // Search down the tree.
    for (;;) {
      if (!q) {
        // Insert new node at the bottom.
        q = node;
        p->_setChild(dir, node);
      }
      else if (_isValidRed(q->_getLeft()) && _isValidRed(q->_getRight())) {
        // Color flip.
        q->_makeRed();
        q->_getLeft()->_makeBlack();
        q->_getRight()->_makeBlack();
      }

      // Fix red violation.
      if (_isValidRed(q) && _isValidRed(p)) {
        ASMJIT_ASSUME(g != nullptr);
        ASMJIT_ASSUME(p != nullptr);
        t->_setChild(t->_getRight() == g,
                     q == p->_getChild(last) ? _singleRotate(g, !last) : _doubleRotate(g, !last));
      }

      // Stop if found.
      if (q == node)
        break;

      last = dir;
      dir = cmp(*static_cast<NodeT*>(q), *static_cast<NodeT*>(node)) < 0;

      // Update helpers.
      if (g) t = g;

      g = p;
      p = q;
      q = q->_getChild(dir);
    }

    // Update root and make it black.
    _root = static_cast<NodeT*>(head._getRight());
    _root->_makeBlack();
  }